

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMParentNode.cpp
# Opt level: O2

DOMNode * __thiscall
xercesc_4_0::DOMParentNode::insertBefore(DOMParentNode *this,DOMNode *newChild,DOMNode *refChild)

{
  DOMDocument *pDVar1;
  XMLSize_t XVar2;
  int iVar3;
  DOMNodeImpl *pDVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar5;
  DOMChildNode *pDVar6;
  BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *this_00;
  DOMRangeImpl *this_01;
  DOMException *this_02;
  DOMNode *pDVar7;
  XMLSize_t i;
  XMLSize_t getAt;
  bool bVar8;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  
  if (newChild == (DOMNode *)0x0) {
    this_02 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fOwnerDocument == (DOMDocument *)0x0) {
      pDVar7 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
    }
    else {
      pDVar7 = &this->fOwnerDocument[10].super_DOMNode;
    }
    DOMException::DOMException(this_02,3,0,(MemoryManager *)pDVar7->_vptr_DOMNode);
  }
  else {
    pDVar4 = getContainingNodeImpl(this);
    if ((pDVar4->flags & 1) == 0) {
      iVar3 = (*newChild->_vptr_DOMNode[0xc])(newChild);
      if ((DOMDocument *)CONCAT44(extraout_var,iVar3) == this->fOwnerDocument) {
        iVar3 = (*newChild->_vptr_DOMNode[0x12])(newChild);
        if ((char)iVar3 != '\0') {
          pDVar7 = this->fContainingNode;
          bVar8 = true;
          while( true ) {
            iVar3 = (*pDVar7->_vptr_DOMNode[5])(pDVar7);
            pDVar7 = (DOMNode *)CONCAT44(extraout_var_00,iVar3);
            if ((!bVar8) || (pDVar7 == (DOMNode *)0x0)) break;
            bVar8 = pDVar7 != newChild;
          }
          if (!bVar8) {
            this_02 = (DOMException *)__cxa_allocate_exception(0x28);
            if (this->fOwnerDocument == (DOMDocument *)0x0) {
              pDVar7 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
            }
            else {
              pDVar7 = &this->fOwnerDocument[10].super_DOMNode;
            }
            DOMException::DOMException(this_02,3,0,(MemoryManager *)pDVar7->_vptr_DOMNode);
            goto LAB_002855af;
          }
        }
        if (refChild != (DOMNode *)0x0) {
          iVar3 = (*refChild->_vptr_DOMNode[5])(refChild);
          if ((DOMNode *)CONCAT44(extraout_var_01,iVar3) != this->fContainingNode) {
            this_02 = (DOMException *)__cxa_allocate_exception(0x28);
            if (this->fOwnerDocument == (DOMDocument *)0x0) {
              pDVar7 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
            }
            else {
              pDVar7 = &this->fOwnerDocument[10].super_DOMNode;
            }
            DOMException::DOMException(this_02,8,0,(MemoryManager *)pDVar7->_vptr_DOMNode);
            goto LAB_002855af;
          }
          iVar3 = (*newChild->_vptr_DOMNode[0x1b])(newChild,refChild);
          if ((char)iVar3 != '\0') {
            return newChild;
          }
        }
        iVar3 = (*newChild->_vptr_DOMNode[4])(newChild);
        if (iVar3 == 0xb) {
          iVar3 = (*newChild->_vptr_DOMNode[7])(newChild);
          pDVar7 = (DOMNode *)CONCAT44(extraout_var_02,iVar3);
          while (pDVar7 != (DOMNode *)0x0) {
            bVar8 = DOMDocumentImpl::isKidOK(this->fContainingNode,pDVar7);
            if (!bVar8) {
              this_02 = (DOMException *)__cxa_allocate_exception(0x28);
              if (this->fOwnerDocument == (DOMDocument *)0x0) {
                pDVar7 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
              }
              else {
                pDVar7 = &this->fOwnerDocument[10].super_DOMNode;
              }
              DOMException::DOMException(this_02,3,0,(MemoryManager *)pDVar7->_vptr_DOMNode);
              goto LAB_002855af;
            }
            iVar3 = (*pDVar7->_vptr_DOMNode[10])(pDVar7);
            pDVar7 = (DOMNode *)CONCAT44(extraout_var_03,iVar3);
          }
          while (iVar3 = (*newChild->_vptr_DOMNode[0x12])(newChild), (char)iVar3 != '\0') {
            pDVar7 = this->fContainingNode;
            iVar3 = (*newChild->_vptr_DOMNode[7])(newChild);
            (*pDVar7->_vptr_DOMNode[0xe])(pDVar7,CONCAT44(extraout_var_04,iVar3),refChild);
          }
        }
        else {
          bVar8 = DOMDocumentImpl::isKidOK(this->fContainingNode,newChild);
          if (!bVar8) {
            this_02 = (DOMException *)__cxa_allocate_exception(0x28);
            if (this->fOwnerDocument == (DOMDocument *)0x0) {
              pDVar7 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
            }
            else {
              pDVar7 = &this->fOwnerDocument[10].super_DOMNode;
            }
            DOMException::DOMException(this_02,3,0,(MemoryManager *)pDVar7->_vptr_DOMNode);
            goto LAB_002855af;
          }
          iVar3 = (*newChild->_vptr_DOMNode[5])(newChild);
          plVar5 = (long *)CONCAT44(extraout_var_05,iVar3);
          if (plVar5 != (long *)0x0) {
            (**(code **)(*plVar5 + 0x80))(plVar5,newChild);
          }
          pDVar7 = this->fContainingNode;
          pDVar4 = castToNodeImpl(newChild);
          pDVar4->fOwnerNode = pDVar7;
          pDVar4 = castToNodeImpl(newChild);
          pDVar4->flags = pDVar4->flags | 8;
          pDVar7 = this->fFirstChild;
          if (pDVar7 == (DOMNode *)0x0) {
            this->fFirstChild = newChild;
            pDVar4 = castToNodeImpl(newChild);
            pDVar4->flags = pDVar4->flags | 0x10;
            pDVar7 = newChild;
          }
          else {
            if (refChild != (DOMNode *)0x0) {
              if (pDVar7 == refChild) {
                pDVar4 = castToNodeImpl(pDVar7);
                pDVar4->flags = pDVar4->flags & 0xffef;
                pDVar7 = this->fFirstChild;
                pDVar6 = castToChildImpl(newChild);
                pDVar6->nextSibling = pDVar7;
                pDVar6 = castToChildImpl(this->fFirstChild);
                pDVar7 = pDVar6->previousSibling;
                pDVar6 = castToChildImpl(newChild);
                pDVar6->previousSibling = pDVar7;
                pDVar6 = castToChildImpl(this->fFirstChild);
                pDVar6->previousSibling = newChild;
                this->fFirstChild = newChild;
                pDVar4 = castToNodeImpl(newChild);
                pDVar4->flags = pDVar4->flags | 0x10;
              }
              else {
                pDVar6 = castToChildImpl(refChild);
                pDVar7 = pDVar6->previousSibling;
                pDVar6 = castToChildImpl(newChild);
                pDVar6->nextSibling = refChild;
                pDVar6 = castToChildImpl(pDVar7);
                pDVar6->nextSibling = newChild;
                pDVar6 = castToChildImpl(refChild);
                pDVar6->previousSibling = newChild;
                pDVar6 = castToChildImpl(newChild);
                pDVar6->previousSibling = pDVar7;
              }
              goto LAB_002854b4;
            }
            pDVar6 = castToChildImpl(pDVar7);
            pDVar7 = pDVar6->previousSibling;
            pDVar6 = castToChildImpl(pDVar7);
            pDVar6->nextSibling = newChild;
            pDVar6 = castToChildImpl(newChild);
            pDVar6->previousSibling = pDVar7;
            pDVar7 = this->fFirstChild;
          }
          pDVar6 = castToChildImpl(pDVar7);
          pDVar6->previousSibling = newChild;
        }
LAB_002854b4:
        (*this->fOwnerDocument[-1].super_DOMNode._vptr_DOMNode[0x4e])
                  (&this->fOwnerDocument[-1].super_DOMNode);
        pDVar1 = this->fOwnerDocument;
        if (pDVar1 != (DOMDocument *)0x0) {
          iVar3 = (*pDVar1[-1].super_DOMNode._vptr_DOMNode[0x46])(&pDVar1[-1].super_DOMNode);
          this_00 = (BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *)CONCAT44(extraout_var_06,iVar3);
          if ((this_00 != (BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *)0x0) &&
             (XVar2 = this_00->fCurCount, XVar2 != 0)) {
            for (getAt = 0; XVar2 != getAt; getAt = getAt + 1) {
              this_01 = BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>::elementAt(this_00,getAt);
              DOMRangeImpl::updateRangeForInsertedNode(this_01,newChild);
            }
          }
        }
        return newChild;
      }
      this_02 = (DOMException *)__cxa_allocate_exception(0x28);
      if (this->fOwnerDocument == (DOMDocument *)0x0) {
        pDVar7 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
      }
      else {
        pDVar7 = &this->fOwnerDocument[10].super_DOMNode;
      }
      DOMException::DOMException(this_02,4,0,(MemoryManager *)pDVar7->_vptr_DOMNode);
    }
    else {
      this_02 = (DOMException *)__cxa_allocate_exception(0x28);
      if (this->fOwnerDocument == (DOMDocument *)0x0) {
        pDVar7 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
      }
      else {
        pDVar7 = &this->fOwnerDocument[10].super_DOMNode;
      }
      DOMException::DOMException(this_02,7,0,(MemoryManager *)pDVar7->_vptr_DOMNode);
    }
  }
LAB_002855af:
  __cxa_throw(this_02,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode *DOMParentNode::insertBefore(DOMNode *newChild, DOMNode *refChild) {
    //not really in the specs, but better than nothing
    if(newChild==NULL)
        throw DOMException(DOMException::HIERARCHY_REQUEST_ERR,0, GetDOMParentNodeMemoryManager);

    const DOMNodeImpl *thisNodeImpl = getContainingNodeImpl();
    if (thisNodeImpl->isReadOnly())
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMParentNodeMemoryManager);

    if (newChild->getOwnerDocument() != fOwnerDocument)
        throw DOMException(DOMException::WRONG_DOCUMENT_ERR, 0, GetDOMParentNodeMemoryManager);

    // Prevent cycles in the tree
    //only need to do this if the node has children
    if(newChild->hasChildNodes()) {
        bool treeSafe=true;
        for(DOMNode *a=getContainingNode()->getParentNode();
            treeSafe && a!=0;
            a=a->getParentNode())
            treeSafe=(newChild!=a);
        if(!treeSafe)
            throw DOMException(DOMException::HIERARCHY_REQUEST_ERR,0, GetDOMParentNodeMemoryManager);
    }

    // refChild must in fact be a child of this node (or 0)
    if (refChild!=0 && refChild->getParentNode() != getContainingNode())
        throw DOMException(DOMException::NOT_FOUND_ERR,0, GetDOMParentNodeMemoryManager);

    // if the new node has to be placed before itself, we don't have to do anything
    // (even worse, we would crash if we continue, as we assume they are two distinct nodes)
    if (refChild!=0 && newChild->isSameNode(refChild))
        return newChild;

    if (newChild->getNodeType() == DOMNode::DOCUMENT_FRAGMENT_NODE)
    {
        // SLOW BUT SAFE: We could insert the whole subtree without
        // juggling so many next/previous pointers. (Wipe out the
        // parent's child-list, patch the parent pointers, set the
        // ends of the list.) But we know some subclasses have special-
        // case behavior they add to insertBefore(), so we don't risk it.
        // This approch also takes fewer bytecodes.

        // NOTE: If one of the children is not a legal child of this
        // node, throw HIERARCHY_REQUEST_ERR before _any_ of the children
        // have been transferred. (Alternative behaviors would be to
        // reparent up to the first failure point or reparent all those
        // which are acceptable to the target node, neither of which is
        // as robust. PR-DOM-0818 isn't entirely clear on which it
        // recommends?????

        // No need to check kids for right-document; if they weren't,
        // they wouldn't be kids of that DocFrag.
        for(DOMNode *kid=newChild->getFirstChild(); // Prescan
              kid!=0;
              kid=kid->getNextSibling())
        {
            if (!DOMDocumentImpl::isKidOK(getContainingNode(), kid))
              throw DOMException(DOMException::HIERARCHY_REQUEST_ERR,0, GetDOMParentNodeMemoryManager);
        }
        while(newChild->hasChildNodes())     // Move
            getContainingNode()->insertBefore(newChild->getFirstChild(),refChild);
    }

    else if (!DOMDocumentImpl::isKidOK(getContainingNode(), newChild))
        throw DOMException(DOMException::HIERARCHY_REQUEST_ERR,0, GetDOMParentNodeMemoryManager);

    else
    {
        DOMNode *oldparent=newChild->getParentNode();
        if(oldparent!=0)
            oldparent->removeChild(newChild);

        // Attach up
        castToNodeImpl(newChild)->fOwnerNode = getContainingNode();
        castToNodeImpl(newChild)->isOwned(true);

        // Attach before and after
        // Note: fFirstChild.previousSibling == lastChild!!
        if (fFirstChild == 0) {
            // this our first and only child
            fFirstChild = newChild;
            castToNodeImpl(newChild)->isFirstChild(true);
            // castToChildImpl(newChild)->previousSibling = newChild;
            DOMChildNode *newChild_ci = castToChildImpl(newChild);
            newChild_ci->previousSibling = newChild;
        } else {
            if (refChild == 0) {
                // this is an append
                DOMNode *lastChild = castToChildImpl(fFirstChild)->previousSibling;
                castToChildImpl(lastChild)->nextSibling = newChild;
                castToChildImpl(newChild)->previousSibling = lastChild;
                castToChildImpl(fFirstChild)->previousSibling = newChild;
            } else {
                // this is an insert
                if (refChild == fFirstChild) {
                    // at the head of the list
                    castToNodeImpl(fFirstChild)->isFirstChild(false);
                    castToChildImpl(newChild)->nextSibling = fFirstChild;
                    castToChildImpl(newChild)->previousSibling = castToChildImpl(fFirstChild)->previousSibling;
                    castToChildImpl(fFirstChild)->previousSibling = newChild;
                    fFirstChild = newChild;
                    castToNodeImpl(newChild)->isFirstChild(true);
                } else {
                    // somewhere in the middle
                    DOMNode *prev = castToChildImpl(refChild)->previousSibling;
                    castToChildImpl(newChild)->nextSibling = refChild;
                    castToChildImpl(prev)->nextSibling = newChild;
                    castToChildImpl(refChild)->previousSibling = newChild;
                    castToChildImpl(newChild)->previousSibling = prev;
                }
            }
        }
    }

    changed();

    if (fOwnerDocument != 0) {
        Ranges* ranges = ((DOMDocumentImpl*)fOwnerDocument)->getRanges();
        if ( ranges != 0) {
            XMLSize_t sz = ranges->size();
            if (sz != 0) {
                for (XMLSize_t i =0; i<sz; i++) {
                    ranges->elementAt(i)->updateRangeForInsertedNode(newChild);
                }
            }
        }
    }

    return newChild;
}